

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

Json * Json::parseFile(Json *__return_storage_ptr__,string *path_to_file)

{
  bool bVar1;
  istream *piVar2;
  istream local_280 [8];
  ifstream file_with_json;
  allocator<char> local_71;
  string local_70 [8];
  string s;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string result;
  string *path_to_file_local;
  
  result.field_2._8_8_ = path_to_file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38," ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70," ",&local_71);
  std::allocator<char>::~allocator(&local_71);
  std::ifstream::ifstream(local_280,result.field_2._8_8_,8);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_280,local_70);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)local_38,local_70);
  }
  parse(__return_storage_ptr__,(string *)local_38);
  std::ifstream::~ifstream(local_280);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Json Json::parseFile(const string& path_to_file) {
	string result = " ";
	string s = " ";
	ifstream file_with_json(path_to_file);
	while (getline(file_with_json,s)) {
		result += s;
	}
	return parse(result);
}